

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O2

int32_t toUpperOrTitle(UChar32 c,UCaseContextIterator *iter,void *context,UChar **pString,
                      int32_t loc,UBool upperNotTitle)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  sbyte sVar5;
  UChar32 c_00;
  int32_t iVar6;
  uint uVar7;
  ulong uVar8;
  int8_t iVar9;
  uint uVar10;
  ushort *puVar11;
  long lVar12;
  
  if ((uint)c < 0xd800) {
    uVar10 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar10 = ((uint)c >> 5) + 0x140;
    if (0xdbff < (uint)c) {
      uVar10 = (uint)c >> 5;
    }
  }
  else {
    uVar8 = 0xd30;
    if ((0x10ffff < (uint)c) || (uVar8 = 0x2f1c, 0xe07ff < (uint)c)) goto LAB_00298449;
    uVar10 = ((uint)c >> 5 & 0x3f) + (uint)ucase_props_trieIndex[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar8 = (ulong)((c & 0x1fU) + (uint)ucase_props_trieIndex[uVar10] * 4);
LAB_00298449:
  uVar2 = ucase_props_trieIndex[uVar8];
  if ((uVar2 & 8) == 0) {
    uVar10 = c;
    if ((uVar2 & 3) == 1) {
      uVar10 = ((int)(short)uVar2 >> 7) + c;
    }
  }
  else {
    lVar1 = (ulong)(uVar2 >> 4) * 2;
    lVar12 = lVar1 + 0x2feef2;
    uVar3 = ucase_props_exceptions[uVar2 >> 4];
    if ((uVar3 >> 0xe & 1) == 0) {
      if ((char)uVar3 < '\0') {
        puVar11 = (ushort *)(lVar1 + 0x2feef4 + (ulong)""[uVar3 & 0x7f] * 4);
        if ((uVar3 >> 8 & 1) == 0) {
          puVar11 = (ushort *)(lVar12 + (ulong)""[uVar3 & 0x7f] * 2);
        }
        uVar4 = *puVar11;
        uVar10 = (uint)(uVar4 >> 0xc);
        if (upperNotTitle != '\0') {
          uVar10 = (uint)(uVar4 >> 8);
        }
        if ((uVar10 & 0xf) != 0) {
          uVar8 = 0;
          if (upperNotTitle == '\0') {
            uVar8 = (ulong)(uint)(uVar4 >> 8) & 0xffffffff0000000f;
          }
          *pString = (UChar *)((long)puVar11 +
                              uVar8 * 2 + (ulong)(uVar4 >> 3 & 0x1e) + (ulong)(uVar4 & 0xf) * 2 + 2)
          ;
          return uVar10 & 0xf;
        }
      }
    }
    else {
      if (c == 0x69 && loc == 2) {
        return 0x130;
      }
      if (((iter != (UCaseContextIterator *)0x0) && (c == 0x307)) && (loc == 3)) {
        iVar9 = -1;
        do {
          c_00 = (*iter)(context,iVar9);
          if (c_00 < 0) goto LAB_002985d7;
          iVar6 = getDotType(c_00);
          iVar9 = '\0';
        } while (iVar6 == 0x60);
        if (iVar6 == 0x20) {
          *pString = (UChar *)0x0;
          return 0;
        }
      }
    }
LAB_002985d7:
    if (((uVar2 & 3) == 1) && ((uVar3 & 0x10) != 0)) {
      uVar8 = (ulong)""[uVar3 & 0xf];
      if ((uVar3 >> 8 & 1) == 0) {
        uVar10 = (uint)*(ushort *)(lVar12 + uVar8 * 2);
      }
      else {
        uVar10 = CONCAT22(*(undefined2 *)(lVar12 + uVar8 * 4),
                          *(undefined2 *)(lVar1 + 0x2feef4 + uVar8 * 4));
      }
      uVar7 = -uVar10;
      if ((uVar3 >> 10 & 1) == 0) {
        uVar7 = uVar10;
      }
      return uVar7 + c;
    }
    if ((upperNotTitle == '\0') && ((uVar3 & 8) != 0)) {
      sVar5 = 3;
    }
    else {
      if ((uVar3 & 4) == 0) {
        return ~c;
      }
      sVar5 = 2;
    }
    uVar8 = (ulong)""[(uint)uVar3 & ~(-1 << sVar5)];
    if ((uVar3 >> 8 & 1) == 0) {
      uVar10 = (uint)*(ushort *)(lVar12 + uVar8 * 2);
    }
    else {
      uVar10 = CONCAT22(*(undefined2 *)(lVar12 + uVar8 * 4),
                        *(undefined2 *)(lVar1 + 0x2feef4 + uVar8 * 4));
    }
  }
  return -(uint)(uVar10 == c) ^ uVar10;
}

Assistant:

static int32_t
toUpperOrTitle(UChar32 c,
               UCaseContextIterator *iter, void *context,
               const UChar **pString,
               int32_t loc,
               UBool upperNotTitle) {
    // The sign of the result has meaning, input must be non-negative so that it can be returned as is.
    U_ASSERT(c >= 0);
    UChar32 result=c;
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_GET_TYPE(props)==UCASE_LOWER) {
            result=c+UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props), *pe2;
        uint16_t excWord=*pe++;
        int32_t full, idx;

        pe2=pe;

        if(excWord&UCASE_EXC_CONDITIONAL_SPECIAL) {
            /* use hardcoded conditions and mappings */
            if(loc==UCASE_LOC_TURKISH && c==0x69) {
                /*
                    # Turkish and Azeri

                    # I and i-dotless; I-dot and i are case pairs in Turkish and Azeri
                    # The following rules handle those cases.

                    # When uppercasing, i turns into a dotted capital I

                    0069; 0069; 0130; 0130; tr; # LATIN SMALL LETTER I
                    0069; 0069; 0130; 0130; az; # LATIN SMALL LETTER I
                */
                return 0x130;
            } else if(loc==UCASE_LOC_LITHUANIAN && c==0x307 && isPrecededBySoftDotted(iter, context)) {
                /*
                    # Lithuanian

                    # Lithuanian retains the dot in a lowercase i when followed by accents.

                    # Remove DOT ABOVE after "i" with upper or titlecase

                    0307; 0307; ; ; lt After_Soft_Dotted; # COMBINING DOT ABOVE
                 */
                *pString=nullptr;
                return 0; /* remove the dot (continue without output) */
            } else {
                /* no known conditional special case mapping, use a normal mapping */
            }
        } else if(HAS_SLOT(excWord, UCASE_EXC_FULL_MAPPINGS)) {
            GET_SLOT_VALUE(excWord, UCASE_EXC_FULL_MAPPINGS, pe, full);

            /* start of full case mapping strings */
            ++pe;

            /* skip the lowercase and case-folding result strings */
            pe+=full&UCASE_FULL_LOWER;
            full>>=4;
            pe+=full&0xf;
            full>>=4;

            if(upperNotTitle) {
                full&=0xf;
            } else {
                /* skip the uppercase result string */
                pe+=full&0xf;
                full=(full>>4)&0xf;
            }

            if(full!=0) {
                /* set the output pointer to the result string */
                *pString=reinterpret_cast<const UChar *>(pe);

                /* return the string length */
                return full;
            }
        }

        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_GET_TYPE(props)==UCASE_LOWER) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe2, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        if(!upperNotTitle && HAS_SLOT(excWord, UCASE_EXC_TITLE)) {
            idx=UCASE_EXC_TITLE;
        } else if(HAS_SLOT(excWord, UCASE_EXC_UPPER)) {
            /* here, titlecase is same as uppercase */
            idx=UCASE_EXC_UPPER;
        } else {
            return ~c;
        }
        GET_SLOT_VALUE(excWord, idx, pe2, result);
    }

    return (result==c) ? ~result : result;
}